

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode
JsSetModuleHostInfo(JsModuleRecord requestModule,JsModuleHostInfoKind moduleHostInfo,void *hostInfo)

{
  ScriptContext *scriptContext;
  bool bVar1;
  HRESULT HVar2;
  JsrtContext *pJVar3;
  JsrtContext *context;
  long lVar4;
  Type *pTVar5;
  JsErrorCode JVar6;
  SourceTextModuleRecord *unaff_R13;
  void *unaff_retaddr;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  TTDebuggerAbortException anon_var_0;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((requestModule == (JsModuleRecord)0x0) || (*(int *)((long)requestModule + 8) != 0x65646f4d)) {
    if ((moduleHostInfo < JsModuleHostInfo_InitializeImportMetaCallback) &&
       ((0x46U >> (moduleHostInfo & 0x1f) & 1) != 0)) {
      return JsErrorInvalidArgument;
    }
    pJVar3 = JsrtContext::GetCurrent();
    pTVar5 = &(((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext;
  }
  else {
    unaff_R13 = Js::SourceTextModuleRecord::FromHost(requestModule);
    pTVar5 = &unaff_R13->scriptContext;
  }
  pJVar3 = (JsrtContext *)
           Js::JavascriptLibrary::GetJsrtContext
                     ((pTVar5->ptr->super_ScriptContextBase).javascriptLibrary);
  context = JsrtContext::GetCurrent();
  scriptContext = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                      ExceptionType_OutOfMemory);
  bVar1 = JsrtContext::TrySetCurrent(pJVar3);
  JVar6 = JsErrorWrongThread;
  if (!bVar1) goto LAB_003ada11;
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_a0,scriptContext,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
  pJVar3 = JsrtContext::GetCurrent();
  switch(moduleHostInfo) {
  case JsModuleHostInfo_Exception:
    HVar2 = Js::SourceTextModuleRecord::OnHostException(unaff_R13,hostInfo);
    JVar6 = JsErrorInvalidArgument;
    if (HVar2 == 0) {
      JVar6 = JsNoError;
    }
    goto LAB_003ada05;
  case JsModuleHostInfo_HostDefined:
    lVar4 = 0xd0;
    goto LAB_003ad9e9;
  case JsModuleHostInfo_NotifyModuleReadyCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[4] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_FetchImportedModuleCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[2] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[3] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_Url:
    lVar4 = 0xd8;
LAB_003ad9e9:
    JVar6 = JsNoError;
    Memory::WriteBarrierPtr<void>::WriteBarrierSet
              ((WriteBarrierPtr<void> *)
               ((long)&(unaff_R13->super_ModuleRecordBase).super_FinalizableObject.
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar4),hostInfo);
    goto LAB_003ada05;
  case JsModuleHostInfo_InitializeImportMetaCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[5] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_ReportModuleCompletionCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6] =
         (_func_int *)hostInfo;
    break;
  default:
    JVar6 = JsInvalidModuleHostInfoKind;
    goto LAB_003ada05;
  }
  JVar6 = JsNoError;
LAB_003ada05:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
LAB_003ada11:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library,
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JsrtContext::TrySetCurrent(context);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library);
  return JVar6;
}

Assistant:

CHAKRA_API
JsSetModuleHostInfo(
    _In_opt_ JsModuleRecord requestModule,
    _In_ JsModuleHostInfoKind moduleHostInfo,
    _In_ void* hostInfo)
{
    Js::ScriptContext* scriptContext;
    Js::SourceTextModuleRecord* moduleRecord;
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        if (moduleHostInfo == JsModuleHostInfo_Exception ||
            moduleHostInfo == JsModuleHostInfo_HostDefined ||
            moduleHostInfo == JsModuleHostInfo_Url)
        {
            return JsErrorInvalidArgument;
        }
        scriptContext = JsrtContext::GetCurrent()->GetScriptContext();
    }
    else
    {
        moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
        scriptContext = moduleRecord->GetScriptContext();
    }
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        JsrtContextCore* currentContext = static_cast<JsrtContextCore*>(JsrtContextCore::GetCurrent());
        switch (moduleHostInfo)
        {
        case JsModuleHostInfo_Exception:
            {
            HRESULT hr = moduleRecord->OnHostException(hostInfo);
            return (hr == NOERROR) ? JsNoError : JsErrorInvalidArgument;
            }
        case JsModuleHostInfo_HostDefined:
            moduleRecord->SetHostDefined(hostInfo);
            break;
        case JsModuleHostInfo_FetchImportedModuleCallback:
            currentContext->GetHostScriptContext()->SetFetchImportedModuleCallback(reinterpret_cast<FetchImportedModuleCallBack>(hostInfo));
            break;
        case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
            currentContext->GetHostScriptContext()->SetFetchImportedModuleFromScriptCallback(reinterpret_cast<FetchImportedModuleFromScriptCallBack>(hostInfo));
            break;
        case JsModuleHostInfo_NotifyModuleReadyCallback:
            currentContext->GetHostScriptContext()->SetNotifyModuleReadyCallback(reinterpret_cast<NotifyModuleReadyCallback>(hostInfo));
            break;
        case JsModuleHostInfo_InitializeImportMetaCallback:
            currentContext->GetHostScriptContext()->SetInitializeImportMetaCallback(reinterpret_cast<InitializeImportMetaCallback>(hostInfo));
            break;
        case JsModuleHostInfo_ReportModuleCompletionCallback:
            currentContext->GetHostScriptContext()->SetReportModuleCompletionCallback(reinterpret_cast<ReportModuleCompletionCallback>(hostInfo));
            break;
        case JsModuleHostInfo_Url:
            moduleRecord->SetSpecifier(hostInfo);
            break;
        default:
            return JsInvalidModuleHostInfoKind;
        };
        return JsNoError;
    });
    return errorCode;
}